

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O0

void __thiscall SimpleLineFunctor::~SimpleLineFunctor(SimpleLineFunctor *this)

{
  SimpleLineFunctor *this_local;
  
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::~vector(&this->Points);
  return;
}

Assistant:

int operator()(const Eigen::VectorXd &z, Eigen::VectorXd &fvec) const
    {
        // "a" in the model is z(0), and "b" is z(1)
        double x_i,y_i,a,b;
        for(unsigned int i = 0; i < this->Points.size(); ++i)
        {
            y_i=this->Points[i](1);
            x_i=this->Points[i](0);
            a=z(0);
            b=z(1);
            fvec(i) =y_i-(a*x_i +b);
        }

        return 0;
    }